

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::SplitNDLayerParams::_InternalSerialize
          (SplitNDLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong *puVar1;
  void *data;
  bool bVar2;
  byte *ptr;
  LogMessage *other;
  ulong uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  int size;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong *puVar9;
  size_t __n;
  byte *pbVar10;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar4 = this->axis_;
  if (uVar4 != 0) {
    puVar5 = target;
    if (stream->end_ <= target) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar4 = this->axis_;
    }
    *puVar5 = '\b';
    puVar5[1] = (byte)uVar4;
    if (uVar4 < 0x80) {
      target = puVar5 + 2;
    }
    else {
      puVar5[1] = (byte)uVar4 | 0x80;
      puVar5[2] = (uint8_t)(uVar4 >> 7);
      target = puVar5 + 3;
      if (0x3fff < uVar4) {
        uVar6 = (ulong)puVar5[2];
        uVar4 = uVar4 >> 7;
        do {
          target[-1] = (byte)uVar6 | 0x80;
          uVar3 = uVar4 >> 7;
          *target = (byte)uVar3;
          target = target + 1;
          uVar6 = uVar3 & 0xffffffff;
          bVar2 = 0x3fff < uVar4;
          uVar4 = uVar3;
        } while (bVar2);
      }
    }
  }
  uVar4 = this->numsplits_;
  ptr = target;
  if (uVar4 != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar4 = this->numsplits_;
    }
    *target = 0x10;
    target[1] = (byte)uVar4;
    if (uVar4 < 0x80) {
      ptr = target + 2;
    }
    else {
      target[1] = (byte)uVar4 | 0x80;
      target[2] = (byte)(uVar4 >> 7);
      ptr = target + 3;
      if (0x3fff < uVar4) {
        uVar6 = (ulong)target[2];
        uVar4 = uVar4 >> 7;
        do {
          ptr[-1] = (byte)uVar6 | 0x80;
          uVar3 = uVar4 >> 7;
          *ptr = (byte)uVar3;
          ptr = ptr + 1;
          uVar6 = uVar3 & 0xffffffff;
          bVar2 = 0x3fff < uVar4;
          uVar4 = uVar3;
        } while (bVar2);
      }
    }
  }
  uVar8 = (this->_splitsizes_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar8) {
    pbVar10 = stream->end_;
    if (pbVar10 <= ptr) {
      ptr = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
      pbVar10 = stream->end_;
    }
    if (pbVar10 <= ptr) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    *ptr = 0x1a;
    pbVar10 = ptr + 1;
    uVar7 = uVar8;
    if (0x7f < uVar8) {
      do {
        ptr = pbVar10;
        *ptr = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar10 = ptr + 1;
        bVar2 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar2);
    }
    ptr = ptr + 2;
    *pbVar10 = (byte)uVar8;
    puVar9 = (ulong *)(this->splitsizes_).arena_or_elements_;
    puVar1 = puVar9 + (this->splitsizes_).current_size_;
    do {
      if (stream->end_ <= ptr) {
        ptr = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
      }
      uVar4 = *puVar9;
      *ptr = (byte)uVar4;
      if (uVar4 < 0x80) {
        pbVar10 = ptr + 1;
      }
      else {
        *ptr = (byte)uVar4 | 0x80;
        ptr[1] = (byte)(uVar4 >> 7);
        pbVar10 = ptr + 2;
        if (0x3fff < uVar4) {
          uVar6 = (ulong)ptr[1];
          uVar4 = uVar4 >> 7;
          do {
            pbVar10[-1] = (byte)uVar6 | 0x80;
            uVar3 = uVar4 >> 7;
            *pbVar10 = (byte)uVar3;
            pbVar10 = pbVar10 + 1;
            uVar6 = uVar3 & 0xffffffff;
            bVar2 = 0x3fff < uVar4;
            uVar4 = uVar3;
          } while (bVar2);
        }
      }
      ptr = pbVar10;
      puVar9 = puVar9 + 1;
    } while (puVar9 < puVar1);
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    uVar4 = uVar4 & 0xfffffffffffffffc;
    data = *(void **)(uVar4 + 8);
    size = (int)*(undefined8 *)(uVar4 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)ptr < (long)__n) {
      ptr = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,ptr);
    }
    else {
      memcpy(ptr,data,__n);
      ptr = ptr + __n;
    }
  }
  return ptr;
}

Assistant:

uint8_t* SplitNDLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.SplitNDLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->_internal_axis() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(1, this->_internal_axis(), target);
  }

  // uint64 numSplits = 2;
  if (this->_internal_numsplits() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(2, this->_internal_numsplits(), target);
  }

  // repeated uint64 splitSizes = 3;
  {
    int byte_size = _splitsizes_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          3, _internal_splitsizes(), byte_size, target);
    }
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.SplitNDLayerParams)
  return target;
}